

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQBool sqstd_rex_searchrange
                 (SQRex *exp,SQChar *text_begin,SQChar *text_end,SQChar **out_begin,SQChar **out_end
                 )

{
  SQChar *pSVar1;
  undefined8 *in_RCX;
  SQChar *in_RDX;
  SQChar *in_RSI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  SQInteger node;
  SQChar *cur;
  SQRexNode *in_stack_00000080;
  SQChar *in_stack_00000088;
  SQRexNode *in_stack_00000090;
  SQRex *in_stack_00000098;
  bool local_41;
  long local_40;
  SQChar *local_38;
  SQChar *local_18;
  SQBool local_8;
  
  local_40 = in_RDI[3];
  if (in_RSI < in_RDX) {
    in_RDI[1] = in_RSI;
    *in_RDI = in_RDX;
    pSVar1 = in_RSI;
    do {
      local_18 = pSVar1;
      local_38 = local_18;
      for (; local_40 != -1; local_40 = *(long *)(in_RDI[5] + local_40 * 0x20 + 0x18)) {
        in_RDI[10] = 0;
        local_38 = sqstd_rex_matchnode(in_stack_00000098,in_stack_00000090,in_stack_00000088,
                                       in_stack_00000080);
        if (local_38 == (SQChar *)0x0) break;
      }
      local_41 = local_38 == (SQChar *)0x0 && local_18 + 1 != in_RDX;
      pSVar1 = local_18 + 1;
    } while (local_41);
    if (local_38 == (SQChar *)0x0) {
      local_8 = 0;
    }
    else {
      if (in_RCX != (undefined8 *)0x0) {
        *in_RCX = local_18;
      }
      if (in_R8 != (undefined8 *)0x0) {
        *in_R8 = local_38;
      }
      local_8 = 1;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQBool sqstd_rex_searchrange(SQRex* exp,const SQChar* text_begin,const SQChar* text_end,const SQChar** out_begin, const SQChar** out_end)
{
    const SQChar *cur = NULL;
    SQInteger node = exp->_first;
    if(text_begin >= text_end) return SQFalse;
    exp->_bol = text_begin;
    exp->_eol = text_end;
    do {
        cur = text_begin;
        while(node != -1) {
            exp->_currsubexp = 0;
            cur = sqstd_rex_matchnode(exp,&exp->_nodes[node],cur,NULL);
            if(!cur)
                break;
            node = exp->_nodes[node].next;
        }
        text_begin++;
    } while(cur == NULL && text_begin != text_end);

    if(cur == NULL)
        return SQFalse;

    --text_begin;

    if(out_begin) *out_begin = text_begin;
    if(out_end) *out_end = cur;
    return SQTrue;
}